

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O2

void __thiscall duckdb::FSSTScanState::~FSSTScanState(FSSTScanState *this)

{
  ~FSSTScanState(this);
  operator_delete(this);
  return;
}

Assistant:

explicit FSSTScanState(const idx_t string_block_limit) {
		ResetStoredDelta();
		decompress_buffer.resize(string_block_limit + 1);
	}